

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::FCDUTF16CollationIterator::nextCodePoint
          (FCDUTF16CollationIterator *this,UErrorCode *errorCode)

{
  UChar **ppUVar1;
  char cVar2;
  UChar UVar3;
  UChar *pUVar4;
  UBool UVar5;
  uint uVar6;
  UChar *pUVar7;
  UChar *pUVar8;
  
  cVar2 = this->checkDir;
  while (cVar2 < '\x01') {
    if ((cVar2 == '\0') &&
       (pUVar7 = (this->super_UTF16CollationIterator).pos,
       pUVar7 != (this->super_UTF16CollationIterator).limit)) goto LAB_002375c8;
    switchToForward(this);
    cVar2 = this->checkDir;
  }
  pUVar7 = (this->super_UTF16CollationIterator).pos;
  pUVar4 = (this->super_UTF16CollationIterator).limit;
  uVar6 = 0xffffffff;
  if (pUVar7 != pUVar4) {
    ppUVar1 = &(this->super_UTF16CollationIterator).pos;
    pUVar8 = pUVar7 + 1;
    *ppUVar1 = pUVar8;
    UVar3 = *pUVar7;
    uVar6 = (uint)(ushort)UVar3;
    if ((ushort)UVar3 < 0xc0) {
      if (UVar3 == L'\0') {
        if (pUVar4 != (UChar *)0x0) {
          return 0;
        }
        (this->super_UTF16CollationIterator).pos = pUVar7;
        this->rawLimit = pUVar7;
        (this->super_UTF16CollationIterator).limit = pUVar7;
        return -1;
      }
    }
    else if ((((ulong)(byte)CollationFCD::tcccIndex[(ushort)UVar3 >> 5] != 0) &&
             ((*(uint *)(CollationFCD::tcccBits +
                        (ulong)(byte)CollationFCD::tcccIndex[(ushort)UVar3 >> 5] * 4) >>
               ((ushort)UVar3 & 0x1f) & 1) != 0)) &&
            ((((ushort)UVar3 & 0xff01) == 0xf01 ||
             ((((pUVar8 != pUVar4 && (UVar3 = *pUVar8, 0x2ff < (ushort)UVar3)) &&
               ((ulong)(byte)CollationFCD::lcccIndex[(ushort)UVar3 >> 5] != 0)) &&
              ((*(uint *)(CollationFCD::lcccBits +
                         (ulong)(byte)CollationFCD::lcccIndex[(ushort)UVar3 >> 5] * 4) >>
                ((ushort)UVar3 & 0x1f) & 1) != 0)))))) {
      (this->super_UTF16CollationIterator).pos = pUVar7;
      UVar5 = nextSegment(this,errorCode);
      if (UVar5 == '\0') {
        return -1;
      }
      pUVar7 = *ppUVar1;
LAB_002375c8:
      pUVar8 = pUVar7 + 1;
      (this->super_UTF16CollationIterator).pos = pUVar8;
      uVar6 = (uint)(ushort)*pUVar7;
    }
    if ((((uVar6 & 0xfc00) == 0xd800) && (pUVar8 != (this->super_UTF16CollationIterator).limit)) &&
       (UVar3 = *pUVar8, ((ushort)UVar3 & 0xfc00) == 0xdc00)) {
      (this->super_UTF16CollationIterator).pos = pUVar8 + 1;
      uVar6 = uVar6 * 0x400 + (uint)(ushort)UVar3 + 0xfca02400;
    }
  }
  return uVar6;
}

Assistant:

UChar32
FCDUTF16CollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(checkDir > 0) {
            if(pos == limit) {
                return U_SENTINEL;
            }
            c = *pos++;
            if(CollationFCD::hasTccc(c)) {
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != limit && CollationFCD::hasLccc(*pos))) {
                    --pos;
                    if(!nextSegment(errorCode)) {
                        return U_SENTINEL;
                    }
                    c = *pos++;
                }
            } else if(c == 0 && limit == NULL) {
                limit = rawLimit = --pos;
                return U_SENTINEL;
            }
            break;
        } else if(checkDir == 0 && pos != limit) {
            c = *pos++;
            break;
        } else {
            switchToForward();
        }
    }
    UChar trail;
    if(U16_IS_LEAD(c) && pos != limit && U16_IS_TRAIL(trail = *pos)) {
        ++pos;
        return U16_GET_SUPPLEMENTARY(c, trail);
    } else {
        return c;
    }
}